

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O1

int Pdr_ManSolve_test(Aig_Man_t *pAig,Pdr_Par_t *pPars,Abc_Cex_t **ppCex)

{
  int iVar1;
  
  do {
    do {
    } while (pPars->pFuncStop == (_func_int_int *)0x0);
    iVar1 = (*pPars->pFuncStop)(pPars->RunId);
  } while (iVar1 == 0);
  return -1;
}

Assistant:

int Pdr_ManSolve_test( Aig_Man_t * pAig, Pdr_Par_t * pPars, Abc_Cex_t ** ppCex )
{
    char * p = ABC_ALLOC( char, 111 );
    while ( 1 )
    {
        if ( pPars->pFuncStop && pPars->pFuncStop(pPars->RunId) )
            break;
    }
    ABC_FREE( p );
    return -1;
}